

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccoefct.c
# Opt level: O1

boolean compress_first_pass(j_compress_ptr cinfo,JSAMPIMAGE input_buf)

{
  JCOEF JVar1;
  uint uVar2;
  jpeg_c_coef_controller *pjVar3;
  forward_DCT_ptr p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  uint uVar11;
  boolean bVar12;
  JBLOCKARRAY ppaJVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  JSAMPIMAGE input_buf_00;
  jpeg_component_info *pjVar17;
  uint uVar18;
  ulong uVar19;
  JBLOCKROW paJVar20;
  ulong uVar21;
  JBLOCKROW __s;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar39;
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  int iVar51;
  int iVar58;
  int iVar59;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  int iVar60;
  int iVar64;
  undefined1 in_XMM7 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar68 [16];
  int iVar69;
  long lVar26;
  
  input_buf_00 = input_buf;
  if (0 < cinfo->num_components) {
    uVar10 = cinfo->total_iMCU_rows - 1;
    pjVar17 = cinfo->comp_info;
    pjVar3 = cinfo->coef;
    lVar15 = 0;
    do {
      ppaJVar13 = (*cinfo->mem->access_virt_barray)
                            ((j_common_ptr)cinfo,(jvirt_barray_ptr)(&pjVar3[7].start_pass)[lVar15],
                             *(int *)&pjVar3[1].start_pass * pjVar17->v_samp_factor,
                             pjVar17->v_samp_factor,1);
      if (*(uint *)&pjVar3[1].start_pass < uVar10) {
        uVar11 = pjVar17->v_samp_factor;
      }
      else {
        uVar11 = pjVar17->height_in_blocks % (uint)pjVar17->v_samp_factor;
        if (uVar11 == 0) {
          uVar11 = pjVar17->v_samp_factor;
        }
      }
      uVar18 = pjVar17->width_in_blocks;
      uVar21 = (ulong)uVar18;
      uVar2 = pjVar17->h_samp_factor;
      iVar58 = (int)(uVar21 % (ulong)uVar2);
      uVar19 = (ulong)(uVar2 - iVar58);
      if (iVar58 < 1) {
        uVar19 = uVar21 % (ulong)uVar2;
      }
      iVar58 = (int)uVar19;
      if (0 < (int)uVar11) {
        p_Var4 = cinfo->fdct->forward_DCT[lVar15];
        lVar14 = uVar19 - 1;
        auVar68._8_4_ = (int)lVar14;
        auVar68._0_8_ = lVar14;
        auVar68._12_4_ = (int)((ulong)lVar14 >> 0x20);
        auVar68 = auVar68 ^ _DAT_001ed2b0;
        uVar22 = 0;
        do {
          paJVar20 = ppaJVar13[uVar22];
          (*p_Var4)(cinfo,pjVar17,input_buf[lVar15],paJVar20,
                    pjVar17->DCT_v_scaled_size * (int)uVar22,0,uVar18);
          if (0 < iVar58) {
            memset(paJVar20 + uVar21,0,uVar19 << 7);
            in_XMM9 = _DAT_001ed2b0;
            auVar37._8_4_ = 0xffffffff;
            auVar37._0_8_ = 0xffffffffffffffff;
            auVar37._12_4_ = 0xffffffff;
            JVar1 = paJVar20[uVar21 - 1][0];
            lVar14 = 0;
            auVar23 = _DAT_001ed2a0;
            auVar27 = _DAT_001ff5f0;
            auVar29 = _DAT_00205370;
            auVar31 = _DAT_00205360;
            do {
              auVar33 = auVar23 ^ in_XMM9;
              iVar39 = auVar68._0_4_;
              iVar51 = -(uint)(iVar39 < auVar33._0_4_);
              iVar60 = auVar68._4_4_;
              auVar34._4_4_ = -(uint)(iVar60 < auVar33._4_4_);
              iVar64 = auVar68._8_4_;
              iVar59 = -(uint)(iVar64 < auVar33._8_4_);
              iVar69 = auVar68._12_4_;
              auVar34._12_4_ = -(uint)(iVar69 < auVar33._12_4_);
              auVar42._4_4_ = iVar51;
              auVar42._0_4_ = iVar51;
              auVar42._8_4_ = iVar59;
              auVar42._12_4_ = iVar59;
              auVar61 = pshuflw(in_XMM7,auVar42,0xe8);
              auVar40._4_4_ = -(uint)(auVar33._4_4_ == iVar60);
              auVar40._12_4_ = -(uint)(auVar33._12_4_ == iVar69);
              auVar40._0_4_ = auVar40._4_4_;
              auVar40._8_4_ = auVar40._12_4_;
              auVar65 = pshuflw(in_XMM8,auVar40,0xe8);
              auVar34._0_4_ = auVar34._4_4_;
              auVar34._8_4_ = auVar34._12_4_;
              auVar33 = pshuflw(auVar61,auVar34,0xe8);
              auVar33 = (auVar33 | auVar65 & auVar61) ^ auVar37;
              auVar33 = packssdw(auVar33,auVar33);
              if ((auVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(JCOEF *)((long)paJVar20[uVar21] + lVar14) = JVar1;
              }
              auVar34 = auVar40 & auVar42 | auVar34;
              auVar33 = packssdw(auVar34,auVar34);
              auVar33 = packssdw(auVar33 ^ auVar37,auVar33 ^ auVar37);
              if ((auVar33._0_4_ >> 0x10 & 1) != 0) {
                *(JCOEF *)((long)paJVar20[uVar21 + 1] + lVar14) = JVar1;
              }
              auVar40 = auVar27 ^ in_XMM9;
              iVar51 = -(uint)(iVar39 < auVar40._0_4_);
              auVar52._4_4_ = -(uint)(iVar60 < auVar40._4_4_);
              iVar59 = -(uint)(iVar64 < auVar40._8_4_);
              auVar52._12_4_ = -(uint)(iVar69 < auVar40._12_4_);
              auVar33._4_4_ = iVar51;
              auVar33._0_4_ = iVar51;
              auVar33._8_4_ = iVar59;
              auVar33._12_4_ = iVar59;
              auVar41._4_4_ = -(uint)(auVar40._4_4_ == iVar60);
              auVar41._12_4_ = -(uint)(auVar40._12_4_ == iVar69);
              auVar41._0_4_ = auVar41._4_4_;
              auVar41._8_4_ = auVar41._12_4_;
              auVar52._0_4_ = auVar52._4_4_;
              auVar52._8_4_ = auVar52._12_4_;
              auVar40 = auVar41 & auVar33 | auVar52;
              auVar40 = packssdw(auVar40,auVar40);
              auVar40 = packssdw(auVar40 ^ auVar37,auVar40 ^ auVar37);
              if ((auVar40 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(JCOEF *)((long)paJVar20[uVar21 + 2] + lVar14) = JVar1;
              }
              auVar33 = pshufhw(auVar33,auVar33,0x84);
              auVar42 = pshufhw(auVar41,auVar41,0x84);
              auVar34 = pshufhw(auVar33,auVar52,0x84);
              auVar33 = (auVar34 | auVar42 & auVar33) ^ auVar37;
              auVar33 = packssdw(auVar33,auVar33);
              if ((auVar33 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(JCOEF *)((long)paJVar20[uVar21 + 3] + lVar14) = JVar1;
              }
              auVar33 = auVar29 ^ in_XMM9;
              iVar51 = -(uint)(iVar39 < auVar33._0_4_);
              auVar36._4_4_ = -(uint)(iVar60 < auVar33._4_4_);
              iVar59 = -(uint)(iVar64 < auVar33._8_4_);
              auVar36._12_4_ = -(uint)(iVar69 < auVar33._12_4_);
              auVar43._4_4_ = iVar51;
              auVar43._0_4_ = iVar51;
              auVar43._8_4_ = iVar59;
              auVar43._12_4_ = iVar59;
              auVar40 = pshuflw(auVar40,auVar43,0xe8);
              auVar35._4_4_ = -(uint)(auVar33._4_4_ == iVar60);
              auVar35._12_4_ = -(uint)(auVar33._12_4_ == iVar69);
              auVar35._0_4_ = auVar35._4_4_;
              auVar35._8_4_ = auVar35._12_4_;
              in_XMM8 = pshuflw(auVar65 & auVar61,auVar35,0xe8);
              in_XMM8 = in_XMM8 & auVar40;
              auVar36._0_4_ = auVar36._4_4_;
              auVar36._8_4_ = auVar36._12_4_;
              auVar33 = pshuflw(auVar40,auVar36,0xe8);
              auVar33 = (auVar33 | in_XMM8) ^ auVar37;
              auVar33 = packssdw(auVar33,auVar33);
              if ((auVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(JCOEF *)((long)paJVar20[uVar21 + 4] + lVar14) = JVar1;
              }
              auVar36 = auVar35 & auVar43 | auVar36;
              auVar33 = packssdw(auVar36,auVar36);
              auVar33 = packssdw(auVar33 ^ auVar37,auVar33 ^ auVar37);
              if ((auVar33 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                *(JCOEF *)((long)paJVar20[uVar21 + 5] + lVar14) = JVar1;
              }
              auVar33 = auVar31 ^ in_XMM9;
              iVar51 = -(uint)(iVar39 < auVar33._0_4_);
              auVar53._4_4_ = -(uint)(iVar60 < auVar33._4_4_);
              iVar59 = -(uint)(iVar64 < auVar33._8_4_);
              auVar53._12_4_ = -(uint)(iVar69 < auVar33._12_4_);
              auVar61._4_4_ = iVar51;
              auVar61._0_4_ = iVar51;
              auVar61._8_4_ = iVar59;
              auVar61._12_4_ = iVar59;
              auVar65._4_4_ = -(uint)(auVar33._4_4_ == iVar60);
              auVar65._12_4_ = -(uint)(auVar33._12_4_ == iVar69);
              auVar65._0_4_ = auVar65._4_4_;
              auVar65._8_4_ = auVar65._12_4_;
              auVar53._0_4_ = auVar53._4_4_;
              auVar53._8_4_ = auVar53._12_4_;
              auVar33 = auVar65 & auVar61 | auVar53;
              auVar33 = packssdw(auVar33,auVar33);
              in_XMM7 = packssdw(auVar33 ^ auVar37,auVar33 ^ auVar37);
              if ((in_XMM7 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(JCOEF *)((long)paJVar20[uVar21 + 6] + lVar14) = JVar1;
              }
              auVar33 = pshufhw(auVar61,auVar61,0x84);
              auVar34 = pshufhw(auVar65,auVar65,0x84);
              auVar40 = pshufhw(auVar33,auVar53,0x84);
              auVar33 = (auVar40 | auVar34 & auVar33) ^ auVar37;
              auVar33 = packssdw(auVar33,auVar33);
              if ((auVar33 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(JCOEF *)((long)paJVar20[uVar21 + 7] + lVar14) = JVar1;
              }
              lVar16 = auVar23._8_8_;
              auVar23._0_8_ = auVar23._0_8_ + 8;
              auVar23._8_8_ = lVar16 + 8;
              lVar16 = auVar27._8_8_;
              auVar27._0_8_ = auVar27._0_8_ + 8;
              auVar27._8_8_ = lVar16 + 8;
              lVar16 = auVar29._8_8_;
              auVar29._0_8_ = auVar29._0_8_ + 8;
              auVar29._8_8_ = lVar16 + 8;
              lVar16 = auVar31._8_8_;
              auVar31._0_8_ = auVar31._0_8_ + 8;
              auVar31._8_8_ = lVar16 + 8;
              lVar14 = lVar14 + 0x400;
            } while ((ulong)(iVar58 + 7U >> 3) << 10 != lVar14);
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 != uVar11);
      }
      input_buf_00 = (JSAMPIMAGE)(ulong)uVar11;
      if (*(uint *)&pjVar3[1].start_pass == uVar10) {
        uVar18 = iVar58 + uVar18;
        if ((int)uVar11 < pjVar17->v_samp_factor) {
          lVar16 = (long)(int)uVar11;
          lVar14 = (ulong)uVar2 - 1;
          auVar24._8_4_ = (int)lVar14;
          auVar24._0_8_ = lVar14;
          auVar24._12_4_ = (int)((ulong)lVar14 >> 0x20);
          do {
            paJVar20 = ppaJVar13[lVar16 + -1];
            __s = ppaJVar13[lVar16];
            input_buf_00 = (JSAMPIMAGE)0x0;
            memset(__s,0,(ulong)uVar18 << 7);
            auVar31 = _DAT_00205370;
            auVar29 = _DAT_00205360;
            auVar27 = _DAT_001ff5f0;
            auVar23 = _DAT_001ed2b0;
            auVar68 = _DAT_001ed2a0;
            if (uVar2 <= uVar18) {
              uVar11 = 0;
              do {
                if (0 < (int)uVar2) {
                  JVar1 = paJVar20[(long)(int)uVar2 + -1][0];
                  lVar14 = 0;
                  auVar25 = auVar68;
                  auVar28 = auVar27;
                  auVar30 = auVar31;
                  auVar32 = auVar29;
                  do {
                    auVar37 = auVar24 ^ auVar23;
                    auVar33 = auVar25 ^ auVar23;
                    iVar58 = auVar37._0_4_;
                    iVar60 = -(uint)(iVar58 < auVar33._0_4_);
                    iVar51 = auVar37._4_4_;
                    auVar45._4_4_ = -(uint)(iVar51 < auVar33._4_4_);
                    iVar59 = auVar37._8_4_;
                    iVar64 = -(uint)(iVar59 < auVar33._8_4_);
                    iVar39 = auVar37._12_4_;
                    auVar45._12_4_ = -(uint)(iVar39 < auVar33._12_4_);
                    auVar54._4_4_ = iVar60;
                    auVar54._0_4_ = iVar60;
                    auVar54._8_4_ = iVar64;
                    auVar54._12_4_ = iVar64;
                    auVar37 = pshuflw(in_XMM8,auVar54,0xe8);
                    auVar44._4_4_ = -(uint)(auVar33._4_4_ == iVar51);
                    auVar44._12_4_ = -(uint)(auVar33._12_4_ == iVar39);
                    auVar44._0_4_ = auVar44._4_4_;
                    auVar44._8_4_ = auVar44._12_4_;
                    auVar40 = pshuflw(in_XMM9,auVar44,0xe8);
                    auVar45._0_4_ = auVar45._4_4_;
                    auVar45._8_4_ = auVar45._12_4_;
                    auVar33 = pshuflw(auVar37,auVar45,0xe8);
                    auVar66._8_4_ = 0xffffffff;
                    auVar66._0_8_ = 0xffffffffffffffff;
                    auVar66._12_4_ = 0xffffffff;
                    auVar66 = (auVar33 | auVar40 & auVar37) ^ auVar66;
                    auVar33 = packssdw(auVar66,auVar66);
                    if ((auVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(JCOEF *)((long)*__s + lVar14) = JVar1;
                    }
                    auVar45 = auVar44 & auVar54 | auVar45;
                    auVar33 = packssdw(auVar45,auVar45);
                    auVar5._8_4_ = 0xffffffff;
                    auVar5._0_8_ = 0xffffffffffffffff;
                    auVar5._12_4_ = 0xffffffff;
                    auVar33 = packssdw(auVar33 ^ auVar5,auVar33 ^ auVar5);
                    if ((auVar33._0_4_ >> 0x10 & 1) != 0) {
                      *(JCOEF *)((long)__s[1] + lVar14) = JVar1;
                    }
                    auVar33 = auVar28 ^ auVar23;
                    iVar60 = -(uint)(iVar58 < auVar33._0_4_);
                    auVar62._4_4_ = -(uint)(iVar51 < auVar33._4_4_);
                    iVar64 = -(uint)(iVar59 < auVar33._8_4_);
                    auVar62._12_4_ = -(uint)(iVar39 < auVar33._12_4_);
                    auVar46._4_4_ = iVar60;
                    auVar46._0_4_ = iVar60;
                    auVar46._8_4_ = iVar64;
                    auVar46._12_4_ = iVar64;
                    auVar55._4_4_ = -(uint)(auVar33._4_4_ == iVar51);
                    auVar55._12_4_ = -(uint)(auVar33._12_4_ == iVar39);
                    auVar55._0_4_ = auVar55._4_4_;
                    auVar55._8_4_ = auVar55._12_4_;
                    auVar62._0_4_ = auVar62._4_4_;
                    auVar62._8_4_ = auVar62._12_4_;
                    auVar33 = auVar55 & auVar46 | auVar62;
                    auVar33 = packssdw(auVar33,auVar33);
                    auVar6._8_4_ = 0xffffffff;
                    auVar6._0_8_ = 0xffffffffffffffff;
                    auVar6._12_4_ = 0xffffffff;
                    auVar33 = packssdw(auVar33 ^ auVar6,auVar33 ^ auVar6);
                    if ((auVar33 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(JCOEF *)((long)__s[2] + lVar14) = JVar1;
                    }
                    auVar34 = pshufhw(auVar46,auVar46,0x84);
                    auVar61 = pshufhw(auVar55,auVar55,0x84);
                    auVar42 = pshufhw(auVar34,auVar62,0x84);
                    auVar47._8_4_ = 0xffffffff;
                    auVar47._0_8_ = 0xffffffffffffffff;
                    auVar47._12_4_ = 0xffffffff;
                    auVar47 = (auVar42 | auVar61 & auVar34) ^ auVar47;
                    auVar34 = packssdw(auVar47,auVar47);
                    if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(JCOEF *)((long)__s[3] + lVar14) = JVar1;
                    }
                    auVar34 = auVar30 ^ auVar23;
                    iVar60 = -(uint)(iVar58 < auVar34._0_4_);
                    auVar49._4_4_ = -(uint)(iVar51 < auVar34._4_4_);
                    iVar64 = -(uint)(iVar59 < auVar34._8_4_);
                    auVar49._12_4_ = -(uint)(iVar39 < auVar34._12_4_);
                    auVar56._4_4_ = iVar60;
                    auVar56._0_4_ = iVar60;
                    auVar56._8_4_ = iVar64;
                    auVar56._12_4_ = iVar64;
                    auVar33 = pshuflw(auVar33,auVar56,0xe8);
                    auVar48._4_4_ = -(uint)(auVar34._4_4_ == iVar51);
                    auVar48._12_4_ = -(uint)(auVar34._12_4_ == iVar39);
                    auVar48._0_4_ = auVar48._4_4_;
                    auVar48._8_4_ = auVar48._12_4_;
                    in_XMM9 = pshuflw(auVar40 & auVar37,auVar48,0xe8);
                    in_XMM9 = in_XMM9 & auVar33;
                    auVar49._0_4_ = auVar49._4_4_;
                    auVar49._8_4_ = auVar49._12_4_;
                    auVar37 = pshuflw(auVar33,auVar49,0xe8);
                    auVar67._8_4_ = 0xffffffff;
                    auVar67._0_8_ = 0xffffffffffffffff;
                    auVar67._12_4_ = 0xffffffff;
                    auVar67 = (auVar37 | in_XMM9) ^ auVar67;
                    auVar37 = packssdw(auVar67,auVar67);
                    if ((auVar37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(JCOEF *)((long)__s[4] + lVar14) = JVar1;
                    }
                    auVar49 = auVar48 & auVar56 | auVar49;
                    auVar37 = packssdw(auVar49,auVar49);
                    auVar7._8_4_ = 0xffffffff;
                    auVar7._0_8_ = 0xffffffffffffffff;
                    auVar7._12_4_ = 0xffffffff;
                    auVar37 = packssdw(auVar37 ^ auVar7,auVar37 ^ auVar7);
                    if ((auVar37 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      *(JCOEF *)((long)__s[5] + lVar14) = JVar1;
                    }
                    auVar37 = auVar32 ^ auVar23;
                    auVar63._0_4_ = -(uint)(iVar58 < auVar37._0_4_);
                    auVar63._4_4_ = -(uint)(iVar51 < auVar37._4_4_);
                    auVar63._8_4_ = -(uint)(iVar59 < auVar37._8_4_);
                    auVar63._12_4_ = -(uint)(iVar39 < auVar37._12_4_);
                    auVar50._4_4_ = auVar63._0_4_;
                    auVar50._0_4_ = auVar63._0_4_;
                    auVar50._8_4_ = auVar63._8_4_;
                    auVar50._12_4_ = auVar63._8_4_;
                    iVar58 = -(uint)(auVar37._4_4_ == iVar51);
                    iVar51 = -(uint)(auVar37._12_4_ == iVar39);
                    auVar38._4_4_ = iVar58;
                    auVar38._0_4_ = iVar58;
                    auVar38._8_4_ = iVar51;
                    auVar38._12_4_ = iVar51;
                    auVar57._4_4_ = auVar63._4_4_;
                    auVar57._0_4_ = auVar63._4_4_;
                    auVar57._8_4_ = auVar63._12_4_;
                    auVar57._12_4_ = auVar63._12_4_;
                    in_XMM8 = auVar38 & auVar50 | auVar57;
                    auVar37 = packssdw(auVar63,in_XMM8);
                    auVar8._8_4_ = 0xffffffff;
                    auVar8._0_8_ = 0xffffffffffffffff;
                    auVar8._12_4_ = 0xffffffff;
                    in_XMM7 = packssdw(auVar37 ^ auVar8,auVar37 ^ auVar8);
                    if ((in_XMM7 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(JCOEF *)((long)__s[6] + lVar14) = JVar1;
                    }
                    auVar33 = pshufhw(auVar50,auVar50,0x84);
                    auVar37 = pshufhw(auVar38,auVar38,0x84);
                    auVar40 = pshufhw(auVar33,auVar57,0x84);
                    auVar9._8_4_ = 0xffffffff;
                    auVar9._0_8_ = 0xffffffffffffffff;
                    auVar9._12_4_ = 0xffffffff;
                    auVar37 = packssdw(auVar37 & auVar33,(auVar40 | auVar37 & auVar33) ^ auVar9);
                    input_buf_00 = (JSAMPIMAGE)(ulong)auVar37._14_2_;
                    if ((auVar37 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(JCOEF *)((long)__s[7] + lVar14) = JVar1;
                    }
                    lVar26 = auVar25._8_8_;
                    auVar25._0_8_ = auVar25._0_8_ + 8;
                    auVar25._8_8_ = lVar26 + 8;
                    lVar26 = auVar28._8_8_;
                    auVar28._0_8_ = auVar28._0_8_ + 8;
                    auVar28._8_8_ = lVar26 + 8;
                    lVar26 = auVar30._8_8_;
                    auVar30._0_8_ = auVar30._0_8_ + 8;
                    auVar30._8_8_ = lVar26 + 8;
                    lVar26 = auVar32._8_8_;
                    auVar32._0_8_ = auVar32._0_8_ + 8;
                    auVar32._8_8_ = lVar26 + 8;
                    lVar14 = lVar14 + 0x400;
                  } while ((ulong)(uVar2 + 7 >> 3) << 10 != lVar14);
                }
                paJVar20 = paJVar20 + (int)uVar2;
                uVar11 = uVar11 + 1;
                __s = __s + (int)uVar2;
              } while (uVar11 < uVar18 / uVar2);
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 < pjVar17->v_samp_factor);
        }
      }
      lVar15 = lVar15 + 1;
      pjVar17 = pjVar17 + 1;
    } while (lVar15 < cinfo->num_components);
  }
  bVar12 = compress_output(cinfo,input_buf_00);
  return bVar12;
}

Assistant:

METHODDEF(boolean)
compress_first_pass (j_compress_ptr cinfo, JSAMPIMAGE input_buf)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  JDIMENSION blocks_across, MCUs_across, MCUindex;
  int bi, ci, h_samp_factor, block_row, block_rows, ndummy;
  JCOEF lastDC;
  jpeg_component_info *compptr;
  JBLOCKARRAY buffer;
  JBLOCKROW thisblockrow, lastblockrow;
  forward_DCT_ptr forward_DCT;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Align the virtual buffer for this component. */
    buffer = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr) cinfo, coef->whole_image[ci],
       coef->iMCU_row_num * compptr->v_samp_factor,
       (JDIMENSION) compptr->v_samp_factor, TRUE);
    /* Count non-dummy DCT block rows in this iMCU row. */
    if (coef->iMCU_row_num < last_iMCU_row)
      block_rows = compptr->v_samp_factor;
    else {
      /* NB: can't use last_row_height here, since may not be set! */
      block_rows = (int) (compptr->height_in_blocks % compptr->v_samp_factor);
      if (block_rows == 0) block_rows = compptr->v_samp_factor;
    }
    blocks_across = compptr->width_in_blocks;
    h_samp_factor = compptr->h_samp_factor;
    /* Count number of dummy blocks to be added at the right margin. */
    ndummy = (int) (blocks_across % h_samp_factor);
    if (ndummy > 0)
      ndummy = h_samp_factor - ndummy;
    forward_DCT = cinfo->fdct->forward_DCT[ci];
    /* Perform DCT for all non-dummy blocks in this iMCU row.  Each call
     * on forward_DCT processes a complete horizontal row of DCT blocks.
     */
    for (block_row = 0; block_row < block_rows; block_row++) {
      thisblockrow = buffer[block_row];
      (*forward_DCT) (cinfo, compptr, input_buf[ci], thisblockrow,
		      (JDIMENSION) (block_row * compptr->DCT_v_scaled_size),
		      (JDIMENSION) 0, blocks_across);
      if (ndummy > 0) {
	/* Create dummy blocks at the right edge of the image. */
	thisblockrow += blocks_across; /* => first dummy block */
	FMEMZERO((void FAR *) thisblockrow, ndummy * SIZEOF(JBLOCK));
	lastDC = thisblockrow[-1][0];
	for (bi = 0; bi < ndummy; bi++) {
	  thisblockrow[bi][0] = lastDC;
	}
      }
    }
    /* If at end of image, create dummy block rows as needed.
     * The tricky part here is that within each MCU, we want the DC values
     * of the dummy blocks to match the last real block's DC value.
     * This squeezes a few more bytes out of the resulting file...
     */
    if (coef->iMCU_row_num == last_iMCU_row) {
      blocks_across += ndummy;	/* include lower right corner */
      MCUs_across = blocks_across / h_samp_factor;
      for (block_row = block_rows; block_row < compptr->v_samp_factor;
	   block_row++) {
	thisblockrow = buffer[block_row];
	lastblockrow = buffer[block_row-1];
	FMEMZERO((void FAR *) thisblockrow,
		 (size_t) (blocks_across * SIZEOF(JBLOCK)));
	for (MCUindex = 0; MCUindex < MCUs_across; MCUindex++) {
	  lastDC = lastblockrow[h_samp_factor-1][0];
	  for (bi = 0; bi < h_samp_factor; bi++) {
	    thisblockrow[bi][0] = lastDC;
	  }
	  thisblockrow += h_samp_factor; /* advance to next MCU in row */
	  lastblockrow += h_samp_factor;
	}
      }
    }
  }
  /* NB: compress_output will increment iMCU_row_num if successful.
   * A suspension return will result in redoing all the work above next time.
   */

  /* Emit data to the entropy encoder, sharing code with subsequent passes */
  return compress_output(cinfo, input_buf);
}